

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module_info.cpp
# Opt level: O0

int module_load(Server *server)

{
  Server *server_local;
  
  printf("Loading module info...\n");
  get_version_info();
  refresh_mem_info();
  refresh_disk_info();
  refresh_thread_info();
  Server::append_to_hook<void(*)(Server*)>
            ((vector<void_(*)(Server_*),_std::allocator<void_(*)(Server_*)>_> *)(server + 0x18),
             timer_handler);
  Server::insert_to_front_of_hook<HTTPResponse*(*)(Client*)>
            ((vector<HTTPResponse_*(*)(Client_*),_std::allocator<HTTPResponse_*(*)(Client_*)>_> *)
             server,http_request_handler);
  printf("Loaded module info\n");
  return 0;
}

Assistant:

int module_load(Server *server) {
    printf("Loading module info...\n");
    get_version_info();
    refresh_mem_info();
    refresh_disk_info();
    refresh_thread_info();
    Server::append_to_hook(server->timer_hook, &timer_handler);
    Server::insert_to_front_of_hook(server->http_request_hook, &http_request_handler);
    printf("Loaded module info\n");
    return 0;
}